

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.cpp
# Opt level: O1

void Png_Operation::Save(string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
                        uint32_t height)

{
  byte bVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  FILE *pFVar5;
  void *__ptr;
  size_t __size;
  void *pvVar6;
  imageException *this;
  ulong uVar7;
  long lVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *puVar11;
  undefined1 auVar12 [16];
  png_structp png;
  uint32_t local_54;
  png_infop info;
  uint32_t local_44;
  ulong local_40;
  FILE *local_38;
  
  local_54 = width;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  pFVar5 = fopen((path->_M_dataplus)._M_p,"wb");
  if (pFVar5 == (FILE *)0x0) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Cannot create file for saving");
  }
  else {
    png = (png_structp)png_create_write_struct("1.6.37",0,0,0);
    if (png == (png_structp)0x0) {
      this = (imageException *)__cxa_allocate_exception(0x28);
      imageException::imageException(this,"Cannot create file for saving");
    }
    else {
      local_40 = (ulong)startY;
      info = (png_infop)png_create_info_struct(png);
      if (info != (png_infop)0x0) {
        local_38 = pFVar5;
        png_init_io(png,pFVar5);
        png_set_IHDR(png,info,local_54,height,8,6,0,0,0);
        png_write_info(png,info);
        uVar10 = (ulong)height;
        __ptr = malloc(uVar10 * 8);
        __size = png_get_rowbytes(png,info);
        local_44 = height;
        if (height != 0) {
          uVar7 = 0;
          do {
            pvVar6 = malloc(__size);
            *(void **)((long)__ptr + uVar7 * 8) = pvVar6;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        uVar4 = local_44;
        if (local_44 != 0) {
          bVar1 = image->_colorCount;
          puVar11 = image->_data +
                    (ulong)(startX * bVar1) + (ulong)((int)local_40 * image->_rowSize);
          uVar7 = 0;
          auVar12[8] = 0xff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12[9] = 0xff;
          auVar12[10] = 0xff;
          auVar12[0xb] = 0xff;
          auVar12[0xc] = 0xff;
          auVar12[0xd] = 0xff;
          auVar12[0xe] = 0xff;
          auVar12[0xf] = 0xff;
          do {
            lVar2 = *(long *)((long)__ptr + uVar7 * 8);
            if (bVar1 == 1) {
              if (local_54 != 0) {
                lVar8 = 0;
                do {
                  auVar3 = vpinsrb_avx(auVar12,(uint)puVar11[lVar8],0);
                  auVar3 = vpshufb_avx(auVar3,SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(lVar2 + lVar8 * 4) = auVar3._0_4_;
                  lVar8 = lVar8 + 1;
                } while (local_54 != (uint32_t)lVar8);
              }
            }
            else if (local_54 != 0) {
              lVar8 = 0;
              puVar9 = puVar11;
              do {
                *(uchar *)(lVar2 + 2 + lVar8 * 4) = *puVar9;
                *(uchar *)(lVar2 + 1 + lVar8 * 4) = puVar9[1];
                *(uchar *)(lVar2 + lVar8 * 4) = puVar9[2];
                *(undefined1 *)(lVar2 + 3 + lVar8 * 4) = 0xff;
                lVar8 = lVar8 + 1;
                puVar9 = puVar9 + 3;
              } while (local_54 != (uint32_t)lVar8);
            }
            uVar7 = uVar7 + 1;
            puVar11 = puVar11 + image->_rowSize;
          } while (uVar7 != uVar10);
        }
        png_write_image(png,__ptr);
        png_write_end(png,0);
        fclose(local_38);
        if (uVar4 != 0) {
          uVar7 = 0;
          do {
            free(*(void **)((long)__ptr + uVar7 * 8));
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        free(__ptr);
        png_destroy_write_struct(&png,&info);
        return;
      }
      this = (imageException *)__cxa_allocate_exception(0x28);
      imageException::imageException(this,"Cannot create file for saving");
    }
  }
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        FILE * file = fopen( path.data(), "wb" );
        if( !file )
            throw imageException( "Cannot create file for saving" );

        png_structp png = png_create_write_struct( PNG_LIBPNG_VER_STRING, NULL, NULL, NULL );
        if( !png )
            throw imageException( "Cannot create file for saving" );

        png_infop info = png_create_info_struct( png );
        if( !info )
            throw imageException( "Cannot create file for saving" );

        png_init_io( png, file );

        // Output is 8bit depth, RGBA format
        png_set_IHDR( png, info, width, height, 8, PNG_COLOR_TYPE_RGBA, PNG_INTERLACE_NONE,
                      PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT );

        png_write_info( png, info );

        uint8_t ** row_pointers = reinterpret_cast<uint8_t**>( malloc( sizeof( uint8_t* ) * height ) );

        const size_t rowByteCount = png_get_rowbytes( png, info );

        for( uint32_t y = 0; y < height; ++y )
            row_pointers[y] = reinterpret_cast<uint8_t*>( malloc( rowByteCount ) );

        const bool grayScaleImage = image.colorCount() == PenguinV_Image::GRAY_SCALE;

        const uint8_t * outY = image.data() + startY * image.rowSize() + startX * image.colorCount();
        for( uint32_t y = 0; y < height; ++y, outY += image.rowSize() ) {
            uint8_t * column = row_pointers[y];
            const uint8_t * outX = outY;

            if( grayScaleImage )
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[0] = column[1] = column[2] = *(outX++);
                    column[3] = 255;
                }
            }
            else
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[2] = *(outX++);
                    column[1] = *(outX++);
                    column[0] = *(outX++);
                    column[3] = 255;
                }
            }
        }

        png_write_image( png, row_pointers );
        png_write_end( png, NULL );

        fclose( file );

        for( uint32_t y = 0; y < height; ++y )
            free( row_pointers[y] );
        free( row_pointers );

        png_destroy_write_struct( &png, &info );
    }